

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::StencilTest::initPrograms
          (StencilTest *this,SourceCollections *sourceCollections)

{
  ProgramSources *pPVar1;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [40];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"color_vert",&local_79);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 310 es\nlayout(location = 0) in vec4 position;\nlayout(location = 1) in vec4 color;\nlayout(location = 0) out highp vec4 vtxColor;\nvoid main (void)\n{\n\tgl_Position = position;\n\tvtxColor = color;\n}\n"
             ,&local_7a);
  glu::VertexSource::VertexSource((VertexSource *)local_38,&local_78);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"color_frag",&local_79);
  pPVar1 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "#version 310 es\nlayout(location = 0) in highp vec4 vtxColor;\nlayout(location = 0) out highp vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vtxColor;\n}\n"
             ,&local_7a);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_38,&local_78);
  glu::ProgramSources::operator<<(pPVar1,(ShaderSource *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void StencilTest::initPrograms (SourceCollections& sourceCollections) const
{
	sourceCollections.glslSources.add("color_vert") << glu::VertexSource(
		"#version 310 es\n"
		"layout(location = 0) in vec4 position;\n"
		"layout(location = 1) in vec4 color;\n"
		"layout(location = 0) out highp vec4 vtxColor;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = position;\n"
		"	vtxColor = color;\n"
		"}\n");

	sourceCollections.glslSources.add("color_frag") << glu::FragmentSource(
		"#version 310 es\n"
		"layout(location = 0) in highp vec4 vtxColor;\n"
		"layout(location = 0) out highp vec4 fragColor;\n"
		"void main (void)\n"
		"{\n"
		"	fragColor = vtxColor;\n"
		"}\n");
}